

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

void feat_lore(wchar_t oid)

{
  textblock *tb;
  char *buf;
  feature *pfVar1;
  
  if (f_info[oid].desc != (char *)0x0) {
    pfVar1 = f_info + oid;
    tb = textblock_new();
    buf = string_make(pfVar1->name);
    my_strcap(buf);
    textblock_append_c(tb,'\x0e',"%s");
    string_free(buf);
    textblock_append(tb,"\n");
    textblock_append(tb,"%s",pfVar1->desc);
    textblock_append(tb,"\n");
    textui_textblock_show(tb,(region)ZEXT816(0),(char *)0x0);
    textblock_free(tb);
    return;
  }
  return;
}

Assistant:

static void feat_lore(int oid)
{
	struct feature *feat = &f_info[oid];

	if (feat->desc) {
		textblock *tb = textblock_new();
		char *title = string_make(feat->name);

		my_strcap(title);
		textblock_append_c(tb, COLOUR_L_BLUE, "%s", title);
		string_free(title);
		textblock_append(tb, "\n");
		textblock_append(tb, "%s", feat->desc);
		textblock_append(tb, "\n");
		textui_textblock_show(tb, SCREEN_REGION, NULL);
		textblock_free(tb);
	}
}